

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.h
# Opt level: O2

bool spvtools::utils::
     ParseNumber<spvtools::utils::HexFloat<spvtools::utils::FloatProxy<float>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>>>>
               (char *text,
               HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
               *value_pointer)

{
  uint *puVar1;
  uint uVar2;
  bool bVar3;
  allocator<char> local_1c1;
  string local_1c0 [32];
  istringstream text_stream;
  uint auStack_188 [90];
  
  if (text == (char *)0x0) {
    bVar3 = false;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>(local_1c0,text,&local_1c1);
    std::__cxx11::istringstream::istringstream((istringstream *)&text_stream,local_1c0,_S_in);
    std::__cxx11::string::_M_dispose();
    puVar1 = (uint *)((long)auStack_188 + *(long *)(_text_stream + -0x18));
    *puVar1 = *puVar1 & 0xffffffb5;
    operator>>((istream *)&text_stream,value_pointer);
    if ((*text == '\0') ||
       (uVar2 = *(uint *)((long)auStack_188 + *(long *)(_text_stream + -0x18) + 8), (uVar2 & 3) != 2
       )) {
      bVar3 = false;
    }
    else {
      bVar3 = (uVar2 & 4) == 0;
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)&text_stream);
  }
  return bVar3;
}

Assistant:

bool ParseNumber(const char* text, T* value_pointer) {
  // C++11 doesn't define std::istringstream(int8_t&), so calling this method
  // with a single-byte type leads to implementation-defined behaviour.
  // Similarly for uint8_t.
  static_assert(sizeof(T) > 1,
                "Single-byte types are not supported in this parse method");

  if (!text) return false;
  std::istringstream text_stream(text);
  // Allow both decimal and hex input for integers.
  // It also allows octal input, but we don't care about that case.
  text_stream >> std::setbase(0);
  text_stream >> *value_pointer;

  // We should have read something.
  bool ok = (text[0] != 0) && !text_stream.bad();
  // It should have been all the text.
  ok = ok && text_stream.eof();
  // It should have been in range.
  ok = ok && !text_stream.fail();

  // Work around a bug in the GNU C++11 library. It will happily parse
  // "-1" for uint16_t as 65535.
  if (ok && text[0] == '-')
    ok = !ClampToZeroIfUnsignedType<T>::Clamp(value_pointer);

  return ok;
}